

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::writeAssociativeContainer<QMap<QFont::Tag,float>>
          (QDataStream *s,QMap<QFont::Tag,_float> *c)

{
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar1;
  QDataStream *this;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  
  pQVar1 = (c->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                 *)0x0) {
    sVar4 = 0;
LAB_0048e8c1:
    iVar3 = (int)sVar4;
  }
  else {
    sVar4 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if ((long)sVar4 < 0xfffffffe) goto LAB_0048e8c1;
    if (0x15 < *(int *)(s + 0x18)) {
      this = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,sVar4);
      goto LAB_0048e8cc;
    }
    if (sVar4 != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return s;
    }
    iVar3 = -2;
  }
  QDataStream::operator<<(s,iVar3);
LAB_0048e8cc:
  pQVar1 = (c->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                 *)0x0) {
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var5 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                 *)0x0) {
    p_Var5 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var2 != p_Var5; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    QDataStream::operator<<(s,p_Var2[1]._M_color);
    QDataStream::operator<<(s,*(float *)&p_Var2[1].field_0x4);
  }
  return s;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}